

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_binder.cpp
# Opt level: O2

void __thiscall
duckdb::AlterBinder::AlterBinder
          (AlterBinder *this,Binder *binder,ClientContext *context,TableCatalogEntry *table,
          vector<duckdb::LogicalIndex,_true> *bound_columns,LogicalType *target_type)

{
  ExpressionBinder::ExpressionBinder(&this->super_ExpressionBinder,binder,context,false);
  (this->super_ExpressionBinder)._vptr_ExpressionBinder =
       (_func_int **)&PTR__ExpressionBinder_0178b0d0;
  this->table = table;
  this->bound_columns = bound_columns;
  LogicalType::operator=(&(this->super_ExpressionBinder).target_type,target_type);
  return;
}

Assistant:

AlterBinder::AlterBinder(Binder &binder, ClientContext &context, TableCatalogEntry &table,
                         vector<LogicalIndex> &bound_columns, LogicalType target_type)
    : ExpressionBinder(binder, context), table(table), bound_columns(bound_columns) {
	this->target_type = std::move(target_type);
}